

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vsx-impl.inc.c
# Opt level: O2

void gen_xxspltw(DisasContext_conflict10 *ctx)

{
  uint uVar1;
  
  if (ctx->vsx_enabled != false) {
    uVar1 = ctx->opcode;
    tcg_gen_gvec_dup_mem_ppc64
              (ctx->uc->tcg_ctx,2,(uVar1 >> 0x15 & 0x1f | (uVar1 & 1) << 5) * 0x10 + 0x12b20,
               (uVar1 >> 0xe & 0xc | (uVar1 >> 0xb & 0x1f | (uVar1 & 2) << 4) << 4) + 0x12b20 ^ 0xc,
               0x10,0x10);
    return;
  }
  gen_exception(ctx,0x5e);
  return;
}

Assistant:

static void gen_xxspltw(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int rt = xT(ctx->opcode);
    int rb = xB(ctx->opcode);
    int uim = UIM(ctx->opcode);
    int tofs, bofs;

    if (unlikely(!ctx->vsx_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_VSXU);
        return;
    }

    tofs = vsr_full_offset(rt);
    bofs = vsr_full_offset(rb);
    bofs += uim << MO_32;
#ifndef HOST_WORDS_BIGENDIAN
    bofs ^= 8 | 4;
#endif

    tcg_gen_gvec_dup_mem(tcg_ctx, MO_32, tofs, bofs, 16, 16);
}